

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

int __thiscall
QListModeViewBase::verticalScrollToValue
          (QListModeViewBase *this,int index,ScrollHint hint,bool above,bool below,QRect *area,
          QRect *rect)

{
  ScrollMode SVar1;
  int iVar2;
  int iVar3;
  P _b;
  QScrollBar *pQVar4;
  long lVar5;
  long lVar6;
  ScrollHint hint_00;
  int iVar7;
  long in_FS_OFFSET;
  piter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = index;
  SVar1 = QCommonListViewBase::verticalScrollMode(&this->super_QCommonListViewBase);
  if (SVar1 == ScrollPerItem) {
    if ((this->scrollValueMap).d.size == 0) {
      iVar2 = 0;
    }
    else {
      pQVar4 = QCommonListViewBase::verticalScrollBar(&this->super_QCommonListViewBase);
      iVar2 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
      local_48 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::begin
                                  (&(((this->super_QCommonListViewBase).dd)->hiddenRows).q_hash);
      iVar7 = 0;
      while (local_48.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0
             || local_48.bucket != 0) {
        iVar3 = QPersistentModelIndex::row();
        iVar7 = iVar7 + (uint)(iVar3 <= iVar2);
        QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
        operator++(&local_48);
      }
      pQVar4 = QCommonListViewBase::verticalScrollBar(&this->super_QCommonListViewBase);
      iVar2 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
      lVar5 = (long)(this->scrollValueMap).d.ptr[iVar2] - (long)iVar7;
      lVar6 = (this->flowPositions).d.size + -1;
      if (lVar5 <= lVar6) {
        lVar6 = lVar5;
      }
      lVar5 = 0;
      if (0 < lVar6) {
        lVar5 = lVar6;
      }
      iVar2 = (int)lVar5;
    }
    if (below) {
      hint = PositionAtBottom;
    }
    hint_00 = PositionAtTop;
    if (!above) {
      hint_00 = hint;
    }
    if (hint_00 != EnsureVisible) {
      iVar2 = perItemScrollToValue
                        (this,index,iVar2,((area->y2).m_i - (area->y1).m_i) + 1,hint_00,Vertical,
                         ((this->super_QCommonListViewBase).dd)->wrap,
                         ((rect->y2).m_i - (rect->y1).m_i) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return iVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    iVar2 = QCommonListViewBase::verticalScrollToValue
                      (&this->super_QCommonListViewBase,iVar2,hint,above,below,area,rect);
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QListModeViewBase::verticalScrollToValue(int index, QListView::ScrollHint hint,
                                          bool above, bool below, const QRect &area, const QRect &rect) const
{
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        int value;
        if (scrollValueMap.isEmpty()) {
            value = 0;
        } else {
            int scrollBarValue = verticalScrollBar()->value();
            int numHidden = 0;
            for (const auto &idx : std::as_const(dd->hiddenRows))
                if (idx.row() <= scrollBarValue)
                    ++numHidden;
            value = qBound(0, scrollValueMap.at(verticalScrollBar()->value()) - numHidden, flowPositions.size() - 1);
        }
        if (above)
            hint = QListView::PositionAtTop;
        else if (below)
            hint = QListView::PositionAtBottom;
        if (hint == QListView::EnsureVisible)
            return value;

        return perItemScrollToValue(index, value, area.height(), hint, Qt::Vertical, isWrapping(), rect.height());
    }

    return QCommonListViewBase::verticalScrollToValue(index, hint, above, below, area, rect);
}